

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strip_after_colon.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  ostream *poVar2;
  ulong uVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  string str;
  long *local_30;
  ulong local_28;
  long local_20 [2];
  
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Hello World","");
  plVar1 = (long *)((long)local_30 + local_28);
  lVar5 = (long)local_28 >> 2;
  plVar6 = plVar1;
  if (0 < lVar5) {
    plVar6 = (long *)((long)plVar1 - (local_28 & 0xfffffffffffffffc));
    plVar1 = (long *)((long)plVar1 + lVar5 * -4);
    lVar5 = lVar5 + 1;
    uVar3 = local_28;
    do {
      if (*(char *)((long)local_30 + (uVar3 - 1)) == ':') {
        plVar4 = (long *)((long)local_30 + uVar3);
        goto LAB_001012f3;
      }
      if (*(char *)((long)local_30 + (uVar3 - 2)) == ':') {
        plVar4 = (long *)((long)local_30 + (uVar3 - 1));
        goto LAB_001012f3;
      }
      if (*(char *)((long)local_30 + (uVar3 - 3)) == ':') {
        plVar4 = (long *)((long)local_30 + (uVar3 - 2));
        goto LAB_001012f3;
      }
      if (*(char *)((long)local_30 + (uVar3 - 4)) == ':') {
        plVar4 = (long *)((long)local_30 + (uVar3 - 3));
        goto LAB_001012f3;
      }
      uVar3 = uVar3 - 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)plVar6 - (long)local_30;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      plVar4 = local_30;
      if ((lVar5 != 3) || (plVar4 = plVar6, *(char *)((long)plVar6 + -1) == ':')) goto LAB_001012f3;
      plVar1 = (long *)((long)plVar1 + -1);
      plVar6 = plVar1;
    }
    plVar4 = plVar6;
    if (*(char *)((long)plVar6 + -1) == ':') goto LAB_001012f3;
    plVar6 = (long *)((long)plVar1 + -1);
  }
  plVar4 = plVar6;
  if (*(char *)((long)plVar6 + -1) != ':') {
    plVar4 = local_30;
  }
LAB_001012f3:
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_30,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_30 != plVar4) {
    local_28 = (long)plVar4 - (long)local_30;
    *(undefined1 *)plVar4 = 0;
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_30,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
  string str = "Hello World";
  // Predicate
  auto isColon = [](int ch) { return ch == ':'; };
  // The last element satisfying the predicate or the first element if not found
  // Searching from the end backwards
  auto first = find_if(rbegin(str), rend(str), isColon);

  cout << str << "\n";

  // If found - delete everything after
  if (first != rend(str))
    str.erase(first.base(), end(str));

  cout << str << "\n";
}